

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidBuildContentModel(xmlValidCtxtPtr ctxt,xmlElementPtr elem)

{
  int iVar1;
  xmlAutomataPtr pxVar2;
  xmlAutomataStatePtr pxVar3;
  _xmlRegexp *p_Var4;
  xmlChar local_13a8 [8];
  char expr [5000];
  xmlElementPtr elem_local;
  xmlValidCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlValidCtxtPtr)0x0) || (elem == (xmlElementPtr)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if (elem->type == XML_ELEMENT_DECL) {
    if (elem->etype == XML_ELEMENT_TYPE_ELEMENT) {
      expr._4992_8_ = elem;
      if (elem->contModel == (xmlRegexpPtr)0x0) {
        pxVar2 = xmlNewAutomata();
        ctxt->am = pxVar2;
        if (ctxt->am == (xmlAutomataPtr)0x0) {
          xmlErrValidNode(ctxt,(xmlNodePtr)expr._4992_8_,XML_ERR_INTERNAL_ERROR,
                          "Cannot create automata for element %s\n",
                          *(xmlChar **)(expr._4992_8_ + 0x10),(xmlChar *)0x0,(xmlChar *)0x0);
          ctxt_local._4_4_ = 0;
        }
        else {
          pxVar3 = xmlAutomataGetInitState(ctxt->am);
          ctxt->state = pxVar3;
          xmlValidBuildAContentModel
                    (*(xmlElementContentPtr *)(expr._4992_8_ + 0x50),ctxt,
                     *(xmlChar **)(expr._4992_8_ + 0x10));
          xmlAutomataSetFinalState(ctxt->am,ctxt->state);
          p_Var4 = xmlAutomataCompile(ctxt->am);
          *(_xmlRegexp **)(expr._4992_8_ + 0x68) = p_Var4;
          iVar1 = xmlRegexpIsDeterminist(*(xmlRegexpPtr *)(expr._4992_8_ + 0x68));
          if (iVar1 == 1) {
            ctxt->state = (xmlAutomataStatePtr)0x0;
            xmlFreeAutomata(ctxt->am);
            ctxt->am = (xmlAutomataPtr)0x0;
            ctxt_local._4_4_ = 1;
          }
          else {
            local_13a8[0] = '\0';
            xmlSnprintfElementContent
                      ((char *)local_13a8,5000,*(xmlElementContentPtr *)(expr._4992_8_ + 0x50),1);
            xmlErrValidNode(ctxt,(xmlNodePtr)expr._4992_8_,XML_DTD_CONTENT_NOT_DETERMINIST,
                            "Content model of %s is not deterministic: %s\n",
                            *(xmlChar **)(expr._4992_8_ + 0x10),local_13a8,(xmlChar *)0x0);
            ctxt->valid = 0;
            ctxt->state = (xmlAutomataStatePtr)0x0;
            xmlFreeAutomata(ctxt->am);
            ctxt->am = (xmlAutomataPtr)0x0;
            ctxt_local._4_4_ = 0;
          }
        }
      }
      else {
        iVar1 = xmlRegexpIsDeterminist(elem->contModel);
        if (iVar1 == 0) {
          ctxt->valid = 0;
          ctxt_local._4_4_ = 0;
        }
        else {
          ctxt_local._4_4_ = 1;
        }
      }
    }
    else {
      ctxt_local._4_4_ = 1;
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidBuildContentModel(xmlValidCtxtPtr ctxt, xmlElementPtr elem) {

    if ((ctxt == NULL) || (elem == NULL))
	return(0);
    if (elem->type != XML_ELEMENT_DECL)
	return(0);
    if (elem->etype != XML_ELEMENT_TYPE_ELEMENT)
	return(1);
    /* TODO: should we rebuild in this case ? */
    if (elem->contModel != NULL) {
	if (!xmlRegexpIsDeterminist(elem->contModel)) {
	    ctxt->valid = 0;
	    return(0);
	}
	return(1);
    }

    ctxt->am = xmlNewAutomata();
    if (ctxt->am == NULL) {
	xmlErrValidNode(ctxt, (xmlNodePtr) elem,
	                XML_ERR_INTERNAL_ERROR,
	                "Cannot create automata for element %s\n",
		        elem->name, NULL, NULL);
	return(0);
    }
    ctxt->state = xmlAutomataGetInitState(ctxt->am);
    xmlValidBuildAContentModel(elem->content, ctxt, elem->name);
    xmlAutomataSetFinalState(ctxt->am, ctxt->state);
    elem->contModel = xmlAutomataCompile(ctxt->am);
    if (xmlRegexpIsDeterminist(elem->contModel) != 1) {
	char expr[5000];
	expr[0] = 0;
	xmlSnprintfElementContent(expr, 5000, elem->content, 1);
	xmlErrValidNode(ctxt, (xmlNodePtr) elem,
	                XML_DTD_CONTENT_NOT_DETERMINIST,
	       "Content model of %s is not deterministic: %s\n",
	       elem->name, BAD_CAST expr, NULL);
#ifdef DEBUG_REGEXP_ALGO
        xmlRegexpPrint(stderr, elem->contModel);
#endif
        ctxt->valid = 0;
	ctxt->state = NULL;
	xmlFreeAutomata(ctxt->am);
	ctxt->am = NULL;
	return(0);
    }
    ctxt->state = NULL;
    xmlFreeAutomata(ctxt->am);
    ctxt->am = NULL;
    return(1);
}